

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestConflictingMethodNames::Closure
          (TestConflictingMethodNames *this,RpcController *controller,DummyMessage *param_2,
          DummyMessage *param_3,Closure *done)

{
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Method Closure() not implemented.","");
  (*controller->_vptr_RpcController[6])(controller,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  (*done->_vptr_Closure[2])(done);
  return;
}

Assistant:

void TestConflictingMethodNames::Closure(::google::protobuf::RpcController* PROTOBUF_NULLABLE controller,
                         const ::proto2_unittest::DummyMessage* PROTOBUF_NONNULL,
                         ::proto2_unittest::DummyMessage* PROTOBUF_NONNULL,
                         ::google::protobuf::Closure* PROTOBUF_NULLABLE done) {
  controller->SetFailed("Method Closure() not implemented.");
  done->Run();
}